

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  FieldOptions *this_00;
  LogMessage *other;
  uint32 *puVar3;
  LogFinisher local_6d;
  uint32 index;
  byte local_59;
  LogMessage local_58;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  this_00 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(this_00);
  local_59 = 0;
  if (bVar1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7eb);
    local_59 = 1;
    other = LogMessage::operator<<(&local_58,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  bVar1 = ReflectionSchema::HasHasbits(&this->schema_);
  if (bVar1) {
    uVar2 = ReflectionSchema::HasBitIndex(&this->schema_,local_20);
    puVar3 = MutableHasBits(this,(Message *)field_local);
    puVar3[uVar2 >> 5] = 1 << ((byte)uVar2 & 0x1f) | puVar3[uVar2 >> 5];
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::SetBit(
    Message* message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] |=
      (static_cast<uint32>(1) << (index % 32));
}